

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int param_1,char **argv)

{
  bool bVar1;
  parse_opts_t pVar2;
  uint uVar3;
  opt_t *poVar4;
  int __oflag;
  int __oflag_00;
  int __oflag_01;
  char *pcVar5;
  undefined1 local_2c8 [8];
  Scanner scanner;
  Output output;
  undefined1 local_40 [8];
  Input input;
  char **argv_local;
  int param_0_local;
  
  input.file_name.field_2._8_8_ = argv;
  pVar2 = re2c::parse_opts(argv,(Opt *)&re2c::opts);
  if (pVar2 != OK) {
    if (pVar2 == EXIT_OK) {
      return 0;
    }
    if (pVar2 == EXIT_FAIL) {
      return 1;
    }
  }
  pcVar5 = re2c::opts;
  re2c::Input::Input((Input *)local_40,re2c::opts);
  uVar3 = re2c::Input::open((Input *)local_40,pcVar5,__oflag);
  pcVar5 = DAT_002113f0;
  if ((uVar3 & 1) == 0) {
    re2c::error("cannot open source file: %s",re2c::opts);
    argv_local._4_4_ = 1;
    output.max_fill._0_4_ = 1;
  }
  else {
    poVar4 = re2c::Opt::operator->((Opt *)&re2c::opts);
    re2c::Output::Output((Output *)&scanner.out,pcVar5,poVar4->header_file);
    uVar3 = re2c::OutputFile::open((OutputFile *)&scanner.out,pcVar5,__oflag_00);
    if ((uVar3 & 1) == 0) {
      re2c::error("cannot open output file: %s",DAT_002113f0);
      argv_local._4_4_ = 1;
      output.max_fill._0_4_ = 1;
    }
    else {
      poVar4 = re2c::Opt::operator->((Opt *)&re2c::opts);
      if (((poVar4->tFlag & 1U) == 0) ||
         (uVar3 = re2c::HeaderFile::open
                            ((HeaderFile *)&output.source.label_counter,pcVar5,__oflag_01),
         (uVar3 & 1) != 0)) {
        re2c::Scanner::Scanner((Scanner *)local_2c8,(Input *)local_40,(OutputFile *)&scanner.out);
        re2c::parse((Scanner *)local_2c8,(Output *)&scanner.out);
        bVar1 = re2c::Warn::error((Warn *)re2c::warn);
        argv_local._4_4_ = (uint)bVar1;
        output.max_fill._0_4_ = 1;
        re2c::Scanner::~Scanner((Scanner *)local_2c8);
      }
      else {
        poVar4 = re2c::Opt::operator->((Opt *)&re2c::opts);
        re2c::error("cannot open header file: %s",poVar4->header_file);
        argv_local._4_4_ = 1;
        output.max_fill._0_4_ = 1;
      }
    }
    re2c::Output::~Output((Output *)&scanner.out);
  }
  re2c::Input::~Input((Input *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int, char *argv[])
{
	switch (parse_opts (argv, opts))
	{
		case OK:        break;
		case EXIT_OK:   return 0;
		case EXIT_FAIL: return 1;
	}

	// set up the source stream
	re2c::Input input (opts.source_file);
	if (!input.open ())
	{
		error ("cannot open source file: %s", opts.source_file);
		return 1;
	}

	// set up the output streams
	re2c::Output output (opts.output_file, opts->header_file);
	if (!output.source.open ())
	{
		error ("cannot open output file: %s", opts.output_file);
		return 1;
	}
	if (opts->tFlag && !output.header.open ())
	{
		error ("cannot open header file: %s", opts->header_file);
		return 1;
	}

	Scanner scanner (input, output.source);
	parse (scanner, output);

	return warn.error () ? 1 : 0;
}